

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttext.cc
# Opt level: O0

void __thiscall fasttext::FastText::loadModel(FastText *this,istream *in)

{
  char *pcVar1;
  bool bVar2;
  element_type *peVar3;
  element_type *peVar4;
  element_type *this_00;
  invalid_argument *this_01;
  char *in_RSI;
  long in_RDI;
  shared_ptr<fasttext::Model> *__r;
  shared_ptr<fasttext::Matrix> *unaff_retaddr;
  FastText *in_stack_00000008;
  bool normalizeGradient;
  shared_ptr<fasttext::Loss> loss;
  bool quant_input;
  istream *in_stack_ffffffffffffff28;
  Args *in_stack_ffffffffffffff30;
  shared_ptr<fasttext::Model> *this_02;
  basic_istream<char,_std::char_traits<char>_> *in_stack_ffffffffffffff50;
  shared_ptr<fasttext::Args> *in_stack_ffffffffffffff58;
  undefined7 in_stack_ffffffffffffff60;
  element_type *in_stack_ffffffffffffff68;
  byte local_51 [65];
  char *local_10;
  
  local_10 = in_RSI;
  std::make_shared<fasttext::Args>();
  std::shared_ptr<fasttext::Args>::operator=
            ((shared_ptr<fasttext::Args> *)in_stack_ffffffffffffff30,
             (shared_ptr<fasttext::Args> *)in_stack_ffffffffffffff28);
  std::shared_ptr<fasttext::Args>::~shared_ptr((shared_ptr<fasttext::Args> *)0x183e50);
  std::make_shared<fasttext::DenseMatrix>();
  std::shared_ptr<fasttext::Matrix>::operator=
            ((shared_ptr<fasttext::Matrix> *)in_stack_ffffffffffffff30,
             (shared_ptr<fasttext::DenseMatrix> *)in_stack_ffffffffffffff28);
  std::shared_ptr<fasttext::DenseMatrix>::~shared_ptr((shared_ptr<fasttext::DenseMatrix> *)0x183e80)
  ;
  std::make_shared<fasttext::DenseMatrix>();
  std::shared_ptr<fasttext::Matrix>::operator=
            ((shared_ptr<fasttext::Matrix> *)in_stack_ffffffffffffff30,
             (shared_ptr<fasttext::DenseMatrix> *)in_stack_ffffffffffffff28);
  std::shared_ptr<fasttext::DenseMatrix>::~shared_ptr((shared_ptr<fasttext::DenseMatrix> *)0x183eb0)
  ;
  std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x183eba);
  Args::load(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  if ((*(int *)(in_RDI + 0x6c) == 0xb) &&
     (peVar3 = std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x183edf), peVar3->model == sup)) {
    peVar3 = std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x183eef);
    peVar3->maxn = 0;
  }
  std::make_shared<fasttext::Dictionary,std::shared_ptr<fasttext::Args>&,std::istream&>
            (in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
  std::shared_ptr<fasttext::Dictionary>::operator=
            ((shared_ptr<fasttext::Dictionary> *)in_stack_ffffffffffffff30,
             (shared_ptr<fasttext::Dictionary> *)in_stack_ffffffffffffff28);
  std::shared_ptr<fasttext::Dictionary>::~shared_ptr((shared_ptr<fasttext::Dictionary> *)0x183f33);
  std::istream::read(local_10,(long)local_51);
  if ((local_51[0] & 1) != 0) {
    *(undefined1 *)(in_RDI + 0x68) = 1;
    std::make_shared<fasttext::QuantMatrix>();
    std::shared_ptr<fasttext::Matrix>::operator=
              ((shared_ptr<fasttext::Matrix> *)in_stack_ffffffffffffff30,
               (shared_ptr<fasttext::QuantMatrix> *)in_stack_ffffffffffffff28);
    std::shared_ptr<fasttext::QuantMatrix>::~shared_ptr
              ((shared_ptr<fasttext::QuantMatrix> *)0x183f87);
  }
  peVar4 = std::__shared_ptr_access<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x183f95);
  (*peVar4->_vptr_Matrix[7])(peVar4,local_10);
  if ((local_51[0] & 1) == 0) {
    this_00 = std::
              __shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x183fbe);
    bVar2 = Dictionary::isPruned(this_00);
    if (bVar2) {
      this_01 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::invalid_argument::invalid_argument
                (this_01,
                 "Invalid model file.\nPlease download the updated model from www.fasttext.cc.\nSee issue #332 on Github for more information.\n"
                );
      __cxa_throw(this_01,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument)
      ;
    }
  }
  pcVar1 = local_10;
  peVar3 = std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x18403b);
  std::istream::read(pcVar1,(long)&peVar3->qout);
  if (((*(byte *)(in_RDI + 0x68) & 1) != 0) &&
     (peVar3 = std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x184069), (peVar3->qout & 1U) != 0)) {
    std::make_shared<fasttext::QuantMatrix>();
    std::shared_ptr<fasttext::Matrix>::operator=
              ((shared_ptr<fasttext::Matrix> *)in_stack_ffffffffffffff30,
               (shared_ptr<fasttext::QuantMatrix> *)in_stack_ffffffffffffff28);
    std::shared_ptr<fasttext::QuantMatrix>::~shared_ptr
              ((shared_ptr<fasttext::QuantMatrix> *)0x184099);
  }
  __r = (shared_ptr<fasttext::Model> *)(in_RDI + 0x30);
  peVar4 = std::__shared_ptr_access<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x1840ab);
  (*peVar4->_vptr_Matrix[7])(peVar4,local_10);
  this_02 = (shared_ptr<fasttext::Model> *)&stack0xffffffffffffff68;
  createLoss(in_stack_00000008,unaff_retaddr);
  peVar3 = std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x1840e1);
  std::
  make_shared<fasttext::Model,std::shared_ptr<fasttext::Matrix>&,std::shared_ptr<fasttext::Matrix>&,std::shared_ptr<fasttext::Loss>&,bool&>
            (&in_stack_ffffffffffffff68->wi_,
             (shared_ptr<fasttext::Matrix> *)
             CONCAT17(peVar3->model == sup,in_stack_ffffffffffffff60),
             (shared_ptr<fasttext::Loss> *)in_stack_ffffffffffffff58,
             (bool *)in_stack_ffffffffffffff50);
  std::shared_ptr<fasttext::Model>::operator=(this_02,__r);
  std::shared_ptr<fasttext::Model>::~shared_ptr((shared_ptr<fasttext::Model> *)0x18412c);
  std::shared_ptr<fasttext::Loss>::~shared_ptr((shared_ptr<fasttext::Loss> *)0x184136);
  return;
}

Assistant:

void FastText::loadModel(std::istream& in) {
  args_ = std::make_shared<Args>();
  input_ = std::make_shared<DenseMatrix>();
  output_ = std::make_shared<DenseMatrix>();
  args_->load(in);
  if (version == 11 && args_->model == model_name::sup) {
    // backward compatibility: old supervised models do not use char ngrams.
    args_->maxn = 0;
  }
  dict_ = std::make_shared<Dictionary>(args_, in);

  bool quant_input;
  in.read((char*)&quant_input, sizeof(bool));
  if (quant_input) {
    quant_ = true;
    input_ = std::make_shared<QuantMatrix>();
  }
  input_->load(in);

  if (!quant_input && dict_->isPruned()) {
    throw std::invalid_argument(
        "Invalid model file.\n"
        "Please download the updated model from www.fasttext.cc.\n"
        "See issue #332 on Github for more information.\n");
  }

  in.read((char*)&args_->qout, sizeof(bool));
  if (quant_ && args_->qout) {
    output_ = std::make_shared<QuantMatrix>();
  }
  output_->load(in);

  auto loss = createLoss(output_);
  bool normalizeGradient = (args_->model == model_name::sup);
  model_ = std::make_shared<Model>(input_, output_, loss, normalizeGradient);
}